

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<__gnu_cxx::__normal_iterator<const_vk::VkPresentModeKHR_*,_std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>_>_>
                    *fmt)

{
  VkPresentModeKHR *pVVar1;
  
  std::operator<<(str,"{ ");
  for (pVVar1 = (fmt->begin)._M_current; pVVar1 != (fmt->end)._M_current; pVVar1 = pVVar1 + 1) {
    if (pVVar1 != (fmt->begin)._M_current) {
      std::operator<<(str,", ");
    }
    ::vk::operator<<(str,*pVVar1);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}